

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O0

Validity * __thiscall
kj::TestRunner::setFilter(Validity *__return_storage_ptr__,TestRunner *this,StringPtr pattern)

{
  size_t sVar1;
  bool bVar2;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar3;
  char *pcVar4;
  ulong uVar5;
  StringPtr SVar6;
  ArrayPtr<const_char> local_110;
  long local_100;
  TestCase *testCase;
  char *local_f0;
  undefined1 local_e8 [8];
  GlobFilter filter;
  char *part2;
  undefined1 auStack_90 [7];
  bool parsedRange;
  StringPtr lineStr;
  char *end;
  unsigned_long *colonPos;
  StringPtr local_60;
  undefined1 local_50 [8];
  NullableValue<unsigned_long> _colonPos173;
  uint maxLine;
  uint minLine;
  ArrayPtr<const_char> filePattern;
  TestRunner *this_local;
  StringPtr pattern_local;
  
  pattern_local.content.ptr = (char *)pattern.content.size_;
  this_local = (TestRunner *)pattern.content.ptr;
  this->hasFilter = true;
  pattern_local.content.size_ = (size_t)__return_storage_ptr__;
  _maxLine = StringPtr::operator_cast_to_ArrayPtr((StringPtr *)&this_local);
  _colonPos173.field_1.value._4_4_ =
       MinValue_::operator_cast_to_unsigned_int((MinValue_ *)&minValue);
  _colonPos173.field_1.value._0_4_ =
       MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&maxValue);
  StringPtr::findLast(&local_60,(char)(StringPtr *)&this_local);
  other = kj::_::readMaybe<unsigned_long>((Maybe<unsigned_long> *)&local_60);
  kj::_::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_50,other)
  ;
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&local_60);
  puVar3 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_50);
  if (puVar3 != (unsigned_long *)0x0) {
    puVar3 = kj::_::NullableValue<unsigned_long>::operator*
                       ((NullableValue<unsigned_long> *)local_50);
    SVar6 = StringPtr::slice((StringPtr *)&this_local,*puVar3 + 1);
    lineStr.content.ptr = (char *)SVar6.content.size_;
    _auStack_90 = SVar6.content.ptr;
    bVar2 = false;
    pcVar4 = StringPtr::cStr((StringPtr *)auStack_90);
    uVar5 = strtoul(pcVar4,(char **)&lineStr.content.size_,0);
    sVar1 = lineStr.content.size_;
    _colonPos173.field_1.value._4_4_ = (undefined4)uVar5;
    pcVar4 = StringPtr::begin((StringPtr *)auStack_90);
    if ((char *)sVar1 != pcVar4) {
      if (*(char *)lineStr.content.size_ == '-') {
        pcVar4 = (char *)(lineStr.content.size_ + 1);
        uVar5 = strtoul(pcVar4,(char **)&lineStr.content.size_,0);
        _colonPos173.field_1.value._0_4_ = (undefined4)uVar5;
        if ((pcVar4 < lineStr.content.size_) && (*(char *)lineStr.content.size_ == '\0')) {
          bVar2 = true;
        }
      }
      else {
        bVar2 = *(char *)lineStr.content.size_ == '\0';
        if (bVar2) {
          _colonPos173.field_1.value._0_4_ = _colonPos173.field_1.value._4_4_;
        }
      }
    }
    if (bVar2) {
      _maxLine = StringPtr::first((StringPtr *)&this_local,*puVar3);
      filter.states.builder.disposer = (ArrayDisposer *)(char *)maxLine;
    }
    else {
      _colonPos173.field_1.value._4_4_ =
           MinValue_::operator_cast_to_unsigned_int((MinValue_ *)&minValue);
      _colonPos173.field_1.value._0_4_ =
           MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&maxValue);
    }
  }
  kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_50);
  testCase = _maxLine;
  local_f0 = filePattern.ptr;
  GlobFilter::GlobFilter((GlobFilter *)local_e8,_maxLine);
  for (local_100 = (anonymous_namespace)::testCasesHead; local_100 != 0;
      local_100 = *(long *)(local_100 + 0x20)) {
    if ((*(byte *)(local_100 + 0x30) & 1) == 0) {
      StringPtr::StringPtr((StringPtr *)&local_110,*(char **)(local_100 + 8));
      bVar2 = GlobFilter::matches((GlobFilter *)local_e8,(StringPtr)local_110);
      if (((bVar2) && ((uint)_colonPos173.field_1.value._4_4_ <= *(uint *)(local_100 + 0x10))) &&
         (*(uint *)(local_100 + 0x10) <= (uint)_colonPos173.field_1.value._0_4_)) {
        *(undefined1 *)(local_100 + 0x30) = 1;
      }
    }
  }
  MainBuilder::Validity::Validity(__return_storage_ptr__,true);
  GlobFilter::~GlobFilter((GlobFilter *)local_e8);
  return __return_storage_ptr__;
}

Assistant:

MainBuilder::Validity setFilter(StringPtr pattern) {
    hasFilter = true;
    ArrayPtr<const char> filePattern = pattern;
    uint minLine = kj::minValue;
    uint maxLine = kj::maxValue;

    KJ_IF_SOME(colonPos, pattern.findLast(':')) {
      char* end;
      StringPtr lineStr = pattern.slice(colonPos + 1);

      bool parsedRange = false;
      minLine = strtoul(lineStr.cStr(), &end, 0);
      if (end != lineStr.begin()) {
        if (*end == '-') {
          // A range.
          const char* part2 = end + 1;
          maxLine = strtoul(part2, &end, 0);
          if (end > part2 && *end == '\0') {
            parsedRange = true;
          }
        } else if (*end == '\0') {
          parsedRange = true;
          maxLine = minLine;
        }
      }

      if (parsedRange) {
        // We have an exact line number.
        filePattern = pattern.first(colonPos);
      } else {
        // Can't parse as a number. Maybe the colon is part of a Windows path name or something.
        // Let's just keep it as part of the file pattern.
        minLine = kj::minValue;
        maxLine = kj::maxValue;
      }
    }

    kj::GlobFilter filter(filePattern);

    for (TestCase* testCase = testCasesHead; testCase != nullptr; testCase = testCase->next) {
      if (!testCase->matchedFilter && filter.matches(testCase->file) &&
          testCase->line >= minLine && testCase->line <= maxLine) {
        testCase->matchedFilter = true;
      }
    }

    return true;
  }